

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavesplit.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  CommandOptions Options;
  CommandOptions local_e8 [3];
  Result_t result;
  char *local_78;
  
  Kumu::Result_t::Result_t(&result,(Result_t *)&Kumu::RESULT_OK);
  CommandOptions::CommandOptions(&Options,argc,argv);
  if (Options.help_flag == true) {
    usage((FILE *)_stderr);
    iVar1 = 0;
    goto LAB_0010429f;
  }
  if (Options.error_flag != false) {
    iVar1 = 3;
    goto LAB_0010429f;
  }
  if (Options.version_flag == true) {
    banner((FILE *)_stderr);
  }
  if (Options.info_flag == true) {
    wav_file_info(local_e8);
    Kumu::Result_t::operator=(&result,(Result_t *)local_e8);
LAB_00104284:
    Kumu::Result_t::~Result_t((Result_t *)local_e8);
  }
  else if (Options.create_flag == true) {
    split_wav_file(local_e8);
    Kumu::Result_t::operator=(&result,(Result_t *)local_e8);
    goto LAB_00104284;
  }
  iVar1 = 0;
  if (_result != Kumu::RESULT_OK) {
    fputs("Program stopped on error.\n",_stderr);
    iVar1 = 1;
    if (_result != Kumu::RESULT_FAIL) {
      fputs(local_78,_stderr);
      fputc(10,_stderr);
    }
  }
LAB_0010429f:
  Kumu::Result_t::~Result_t(&result);
  return iVar1;
}

Assistant:

int
main(int argc, const char** argv)
{
  Result_t result = RESULT_OK;
  CommandOptions Options(argc, argv);

  if ( Options.help_flag )
    {
      usage();
      return 0;
    }

  if ( Options.error_flag )
    return 3;

  if ( Options.version_flag )
    banner();

  if ( Options.info_flag )
    result = wav_file_info(Options);

  else if ( Options.create_flag )
    result = split_wav_file(Options);

  if ( result != RESULT_OK )
    {
      fputs("Program stopped on error.\n", stderr);

      if ( result != RESULT_FAIL )
	{
	  fputs(result, stderr);
	  fputc('\n', stderr);
	}

      return 1;
    }

  return 0;
}